

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8bd70::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  char *name;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pointer pbVar9;
  long lVar10;
  long lVar11;
  Slice local_68;
  
  iVar3 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar5 = (dw->min).y;
  lVar8 = (long)((iVar3 - iVar1) + 1);
  if (iVar2 < iVar5 || iVar3 < iVar1) {
    lVar8 = 1;
  }
  lVar6 = (long)((iVar2 - iVar5) + 1);
  if (iVar2 < iVar5 || iVar3 < iVar1) {
    lVar6 = 1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (data,lVar8 * ((long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar6);
  pbVar9 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
    lVar6 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      if ((!dontbotherloadingdepth) ||
         ((iVar3 = std::__cxx11::string::compare
                             ((char *)((long)&(pbVar9->_M_dataplus)._M_p + lVar8)), iVar3 != 0 &&
          (iVar3 = std::__cxx11::string::compare
                             ((char *)((long)&(((this->_channels).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar8)), iVar3 != 0)))) {
        pbVar9 = (this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = (dw->min).x;
        iVar1 = (dw->min).y;
        iVar2 = (dw->max).x;
        iVar5 = (iVar2 - iVar3) + 1;
        lVar11 = (long)iVar5 * 4;
        if ((dw->max).y < iVar1 || iVar2 < iVar3) {
          iVar5 = 1;
          lVar11 = 4;
        }
        lVar4 = (long)(this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
        lVar10 = lVar4 >> 5;
        name = *(char **)((long)&(pbVar9->_M_dataplus)._M_p + lVar8);
        Imf_2_5::Slice::Slice
                  (&local_68,this->_type,
                   (char *)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                  super__Vector_impl_data._M_start +
                           lVar6 + (iVar5 * iVar1 + iVar3) * lVar10 * -4),lVar4 >> 3,lVar10 * lVar11
                   ,1,1,0.0,true,false);
        Imf_2_5::FrameBuffer::insert(framebuf,name,&local_68);
      }
      uVar7 = uVar7 + 1;
      pbVar9 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
      lVar6 = lVar6 + 4;
    } while (uVar7 < (ulong)((long)(this->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5));
  }
  return;
}

Assistant:

void 
    setUpFrameBuffer(vector<T> & data,FrameBuffer & framebuf,const Box2i & dw,bool dontbotherloadingdepth) const
    {
        
        // allocate enough space for all channels (even the depth channel)
        data.resize(_channels.size()*(dw.size().x+1)*(dw.size().y+1));
        for(size_t i=0;i<_channels.size();i++)
        {
            if(!dontbotherloadingdepth || (_channels[i]!="Z" && _channels[i]!="ZBack") )
            {
                framebuf.insert(_channels[i].c_str(),
                                Slice(_type,(char *) (&data[i] - (dw.min.x + dw.min.y*(dw.size().x+1))*_channels.size() ),
                                      sizeof(T)*_channels.size(),
                                      sizeof(T)*(dw.size().x+1)*_channels.size())
                                      );
            }
        }
    }